

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddVarint
          (UnknownFieldLiteParserHelper *this,uint32_t num,uint64_t value)

{
  uint64_t value_local;
  uint32_t num_local;
  UnknownFieldLiteParserHelper *this_local;
  
  if (this->unknown_ != (string *)0x0) {
    WriteVarint((ulong)(num << 3),this->unknown_);
    WriteVarint(value,this->unknown_);
  }
  return;
}

Assistant:

void AddVarint(uint32_t num, uint64_t value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8, unknown_);
    WriteVarint(value, unknown_);
  }